

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O3

MPI_Datatype mxx::datatype_builder<std::pair<int,_int>_>::get_type(void)

{
  long __tmp;
  ompi_datatype_t *__tmp_1;
  int blocklen [2];
  pair<int,_int> p;
  MPI_Datatype struct_type;
  MPI_Aint t2_adr;
  MPI_Aint t1_adr;
  MPI_Aint p_adr;
  MPI_Datatype _type;
  long local_78;
  long local_70;
  undefined *local_68;
  undefined *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  long local_40;
  long local_38;
  long local_30;
  MPI_Datatype local_28;
  
  local_58 = 0x100000001;
  local_50 = 0;
  MPI_Get_address(&local_50,&local_30);
  MPI_Get_address(&local_50,&local_38);
  MPI_Get_address((long)&local_50 + 4,&local_40);
  local_68 = &ompi_mpi_int;
  local_78 = local_38 - local_30;
  local_70 = local_40 - local_30;
  if (local_40 < local_38) {
    local_78 = local_40 - local_30;
    local_70 = local_38 - local_30;
  }
  local_60 = &ompi_mpi_int;
  MPI_Type_create_struct(2,&local_58,&local_78,&local_68,&local_48);
  MPI_Type_create_resized(local_48,0,8,&local_28);
  MPI_Type_commit(&local_28);
  MPI_Type_free(&local_48);
  return local_28;
}

Assistant:

static MPI_Datatype get_type() {
        MPI_Datatype _type;

        int blocklen[2] = {1, 1};
        MPI_Aint displs[2] = {0,0};
        // get actual displacement (in case of padding in the structure)
        std::pair<T1, T2> p;
        MPI_Aint p_adr, t1_adr, t2_adr;
        MPI_Get_address(&p, &p_adr);
        MPI_Get_address(&p.first, &t1_adr);
        MPI_Get_address(&p.second, &t2_adr);
        displs[0] = t1_adr - p_adr;
        displs[1] = t2_adr - p_adr;

        // create type
        // TODO: use cached type!
        MPI_Datatype types[2] = {datatype_builder<T1>::get_type(), datatype_builder<T2>::get_type()};
        // in case elements are represented the opposite way around in
        // the pair (gcc does so), then swap them
        if (displs[0] > displs[1]) {
            std::swap(displs[0], displs[1]);
            std::swap(types[0], types[1]);
        }
        // create MPI_Datatype (resized to actual sizeof())
        MPI_Datatype struct_type;
        MPI_Type_create_struct(2, blocklen, displs, types, &struct_type);
        MPI_Type_create_resized(struct_type, 0, sizeof(p), &_type);
        MPI_Type_commit(&_type);
        MPI_Type_free(&struct_type);
        return _type;
    }